

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfactory.h
# Opt level: O1

Timer * soplex::TimerFactory::switchTimer(Timer *timer,TYPE ttype)

{
  TYPE TVar1;
  Timer *pTVar2;
  
  TVar1 = (*timer->_vptr_Timer[5])();
  if (TVar1 == ttype) {
    return timer;
  }
  free(timer);
  pTVar2 = createTimer(ttype);
  return pTVar2;
}

Assistant:

static Timer* switchTimer(Timer* timer, Timer::TYPE ttype)
   {
      // check whether the type is different from the current one
      if(ttype != timer->type())
      {
         // @todo transfer the old times
         spx_free(timer);
         timer = createTimer(ttype);
      }

      return timer;
   }